

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_1,_1>::calcStatesStates
          (BeagleCPUSSEImpl<double,_1,_1> *this,double *destP,int *states_q,double *matrices_q,
          int *states_r,double *matrices_r,int startPattern,int endPattern)

{
  double *in_RCX;
  int *in_RDX;
  double *in_RSI;
  BeagleCPUImpl<double,_1,_1> *in_RDI;
  int *in_R8;
  double *in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  
  BeagleCPUImpl<double,_1,_1>::calcStatesStates
            (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010);
  return;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
void BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcStatesStates(double* destP,
                                                               const int* states_q,
                                                               const double* matrices_q,
                                                               const int* states_r,
                                                               const double* matrices_r,
                                                               int startPattern,
                                                               int endPattern) {

	BeagleCPUImpl<BEAGLE_CPU_SSE_DOUBLE>::calcStatesStates(destP,
                                                           states_q,
                                                           matrices_q,
                                                           states_r,
                                                           matrices_r,
                                                           startPattern,
                                                           endPattern);
}